

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::Tcmp<int>(VM *this)

{
  int_t iVar1;
  int_t iVar2;
  int_t lhs;
  int_t rhs;
  VM *this_local;
  
  iVar1 = POP<int>(this);
  iVar2 = POP<int>(this);
  if (iVar1 < iVar2) {
    PUSH<int>(this,1);
  }
  else if (iVar2 < iVar1) {
    PUSH<int>(this,-1);
  }
  else {
    PUSH<int>(this,0);
  }
  return;
}

Assistant:

void VM::Tcmp() {
    static_assert(std::is_arithmetic_v<T>);
    auto rhs = POP<T>();
    auto lhs = POP<T>();
    if constexpr (std::is_floating_point_v<T>) {
        if (std::isnan(lhs) || std::isnan(rhs)) {
            PUSH(0);
            return;
        }
        else if (std::isinf(lhs) && std::isinf(rhs) && lhs * rhs > 0) {
            PUSH(0);
            return;
        }
    }
    if (lhs > rhs) {
        PUSH(1);
    }
    else if (lhs < rhs) {
        PUSH(-1);
    }
    else {
        PUSH(0);
    }
}